

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall MSX::Speaker<false>::Speaker(Speaker<false> *this)

{
  Speaker<false> *this_local;
  
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay,AY38910,&this->audio_queue);
  Audio::Toggle::Toggle(&this->audio_toggle,&this->audio_queue);
  Konami::SCC::SCC(&this->scc,&this->audio_queue);
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>::
  CompoundSource(&this->mixer,&this->ay,&this->audio_toggle,&this->scc);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>
  ::PullLowpass(&this->speaker,&this->mixer);
  return;
}

Assistant:

Speaker() :
		ay(GI::AY38910::Personality::AY38910, audio_queue),
		audio_toggle(audio_queue),
		scc(audio_queue),
		mixer(ay, audio_toggle, scc),
		speaker(mixer) {}